

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O2

void duckdb::ModeFunction<duckdb::ModeStandard<duckdb::hugeint_t>>::
     Window<duckdb::ModeState<duckdb::hugeint_t,duckdb::ModeStandard<duckdb::hugeint_t>>,duckdb::hugeint_t,duckdb::hugeint_t>
               (AggregateInputData *aggr_input_data,WindowPartitionInput *partition,
               const_data_ptr_t g_state,data_ptr_t l_state,SubFrames *frames,Vector *result,
               idx_t rid)

{
  ValidityMask *pVVar1;
  data_ptr_t pdVar2;
  ulong uVar3;
  undefined8 *puVar4;
  long lVar5;
  pointer pFVar6;
  undefined8 uVar7;
  bool bVar8;
  Allocator *pAVar9;
  MAP_TYPE *pMVar10;
  reference pvVar11;
  const_reference pvVar12;
  const_iterator cVar13;
  FrameBounds *frame;
  pointer pFVar14;
  byte bVar15;
  Updater updater;
  ModeIncluded<duckdb::ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_>_>
  included;
  
  ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_>::InitializePage
            ((ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_> *)l_state,
             partition);
  pVVar1 = partition->filter_mask;
  pdVar2 = result->data;
  FlatVector::VerifyFlatVector(result);
  if (*(long *)l_state == *(long *)(l_state + 8)) {
    ::std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::resize
              ((vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *)l_state,1);
  }
  pMVar10 = *(MAP_TYPE **)(l_state + 0x18);
  included.fmask = pVVar1;
  included.state = (ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_> *)l_state
  ;
  if (pMVar10 == (MAP_TYPE *)0x0) {
    pAVar9 = Allocator::DefaultAllocator();
    pMVar10 = ModeStandard<duckdb::hugeint_t>::CreateEmpty(pAVar9);
    *(MAP_TYPE **)(l_state + 0x18) = pMVar10;
  }
  if ((pMVar10->_M_h)._M_element_count >> 2 < *(ulong *)(l_state + 0x28)) {
    pvVar11 = vector<duckdb::FrameBounds,_true>::back((vector<duckdb::FrameBounds,_true> *)l_state);
    uVar3 = pvVar11->end;
    pvVar12 = vector<duckdb::FrameBounds,_true>::front(frames);
    if (pvVar12->start < uVar3) {
      pvVar12 = vector<duckdb::FrameBounds,_true>::back(frames);
      uVar3 = pvVar12->end;
      pvVar11 = vector<duckdb::FrameBounds,_true>::front
                          ((vector<duckdb::FrameBounds,_true> *)l_state);
      if (pvVar11->start < uVar3) {
        updater.included = &included;
        updater.state =
             (ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_> *)l_state;
        AggregateExecutor::
        IntersectFrames<duckdb::ModeFunction<duckdb::ModeStandard<duckdb::hugeint_t>>::UpdateWindowState<duckdb::ModeState<duckdb::hugeint_t,duckdb::ModeStandard<duckdb::hugeint_t>>,duckdb::hugeint_t>>
                  ((SubFrames *)l_state,frames,&updater);
        goto LAB_01d39ee3;
      }
    }
  }
  ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_>::Reset
            ((ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_> *)l_state);
  pFVar6 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
           super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pFVar14 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
                 super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                 _M_impl.super__Vector_impl_data._M_start; pFVar14 != pFVar6; pFVar14 = pFVar14 + 1)
  {
    for (updater.state =
              (ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_> *)
              pFVar14->start;
        updater.state <
        (ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_> *)pFVar14->end;
        updater.state =
             (ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_> *)
             ((long)&((updater.state)->prevs).
                     super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                     super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                     _M_impl.super__Vector_impl_data._M_start + 1)) {
      bVar8 = ModeIncluded<duckdb::ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_>_>
              ::operator()(&included,(idx_t *)&updater);
      if (bVar8) {
        ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_>::ModeAdd
                  ((ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_> *)l_state
                   ,(idx_t)updater.state);
      }
    }
  }
LAB_01d39ee3:
  bVar15 = l_state[0x30];
  if (bVar15 == 0) {
    cVar13 = ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_>::Scan
                       ((ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_> *)
                        l_state);
    if (cVar13.super__Node_iterator_base<std::pair<const_duckdb::hugeint_t,_duckdb::ModeAttr>,_true>
        ._M_cur == (__node_type *)0x0) {
      bVar15 = l_state[0x30];
    }
    else {
      puVar4 = *(undefined8 **)(l_state + 0x20);
      uVar7 = *(undefined8 *)
               ((long)cVar13.
                      super__Node_iterator_base<std::pair<const_duckdb::hugeint_t,_duckdb::ModeAttr>,_true>
                      ._M_cur + 0x10);
      *puVar4 = *(undefined8 *)
                 ((long)cVar13.
                        super__Node_iterator_base<std::pair<const_duckdb::hugeint_t,_duckdb::ModeAttr>,_true>
                        ._M_cur + 8);
      puVar4[1] = uVar7;
      lVar5 = *(long *)((long)cVar13.
                              super__Node_iterator_base<std::pair<const_duckdb::hugeint_t,_duckdb::ModeAttr>,_true>
                              ._M_cur + 0x18);
      *(long *)(l_state + 0x38) = lVar5;
      bVar15 = lVar5 != 0;
      l_state[0x30] = bVar15;
    }
  }
  if ((bVar15 & 1) == 0) {
    TemplatedValidityMask<unsigned_long>::SetInvalid
              (&(result->validity).super_TemplatedValidityMask<unsigned_long>,rid);
  }
  else {
    uVar7 = (*(undefined8 **)(l_state + 0x20))[1];
    *(undefined8 *)(pdVar2 + rid * 0x10) = **(undefined8 **)(l_state + 0x20);
    *(undefined8 *)(pdVar2 + rid * 0x10 + 8) = uVar7;
  }
  ::std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::operator=
            ((vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *)l_state,
             &frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>);
  return;
}

Assistant:

static void Window(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition,
	                   const_data_ptr_t g_state, data_ptr_t l_state, const SubFrames &frames, Vector &result,
	                   idx_t rid) {
		auto &state = *reinterpret_cast<STATE *>(l_state);

		state.InitializePage(partition);
		const auto &fmask = partition.filter_mask;

		auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
		auto &rmask = FlatVector::Validity(result);
		auto &prevs = state.prevs;
		if (prevs.empty()) {
			prevs.resize(1);
		}

		ModeIncluded<STATE> included(fmask, state);

		if (!state.frequency_map) {
			state.frequency_map = TYPE_OP::CreateEmpty(Allocator::DefaultAllocator());
		}
		const size_t tau_inverse = 4; // tau==0.25
		if (state.nonzero <= (state.frequency_map->size() / tau_inverse) || prevs.back().end <= frames.front().start ||
		    frames.back().end <= prevs.front().start) {
			state.Reset();
			// for f ∈ F do
			for (const auto &frame : frames) {
				for (auto i = frame.start; i < frame.end; ++i) {
					if (included(i)) {
						state.ModeAdd(i);
					}
				}
			}
		} else {
			using Updater = UpdateWindowState<STATE, INPUT_TYPE>;
			Updater updater(state, included);
			AggregateExecutor::IntersectFrames(prevs, frames, updater);
		}

		if (!state.valid) {
			// Rescan
			auto highest_frequency = state.Scan();
			if (highest_frequency != state.frequency_map->end()) {
				*(state.mode) = highest_frequency->first;
				state.count = highest_frequency->second.count;
				state.valid = (state.count > 0);
			}
		}

		if (state.valid) {
			rdata[rid] = TYPE_OP::template Assign<INPUT_TYPE, RESULT_TYPE>(result, *state.mode);
		} else {
			rmask.Set(rid, false);
		}

		prevs = frames;
	}